

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void __thiscall
tcmalloc::SymbolizePrinter::DemangleAndPrint
          (SymbolizePrinter *this,uintptr_t pc,char *filename,int lineno,char *function,
          uintptr_t symval)

{
  uintptr_t local_90;
  undefined1 local_80 [8];
  SymbolizeOutcome outcome;
  undefined1 local_48 [4];
  int status;
  size_t length;
  char *demangled;
  uintptr_t symval_local;
  char *function_local;
  char *pcStack_20;
  int lineno_local;
  char *filename_local;
  uintptr_t pc_local;
  SymbolizePrinter *this_local;
  
  length = 0;
  outcome.original_function._4_4_ = -1;
  demangled = (char *)symval;
  symval_local = (uintptr_t)function;
  function_local._4_4_ = lineno;
  pcStack_20 = filename;
  filename_local = (char *)pc;
  pc_local = (uintptr_t)this;
  if ((function != (char *)0x0) &&
     (length = __cxa_demangle(function,0,local_48,
                              (undefined1 *)((long)&outcome.original_function + 4)),
     outcome.original_function._4_4_ != 0)) {
    tc_free((void *)length);
    length = 0;
  }
  local_80 = (undefined1  [8])filename_local;
  if (length == 0) {
    local_90 = symval_local;
  }
  else {
    local_90 = length;
  }
  outcome.pc = local_90;
  outcome.symval = symval_local;
  outcome.function = pcStack_20;
  outcome.filename._0_4_ = function_local._4_4_;
  outcome._24_8_ = demangled;
  FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)>::operator()
            (&this->outcome_callback_,(SymbolizeOutcome *)local_80);
  tc_free((void *)length);
  return;
}

Assistant:

void DemangleAndPrint(uintptr_t pc, const char* filename, int lineno, const char* function, uintptr_t symval) {
    char* demangled = nullptr;

#if HAVE_CXA_DEMANGLE
    size_t length;
    int status = -1;
    if (function != nullptr) {
      demangled = __cxxabiv1::__cxa_demangle(function, nullptr, &length, &status);
      if (status != 0) {
        free(demangled);
        demangled = nullptr;
      }
    }
#endif

    SymbolizeOutcome outcome;
    outcome.pc = pc;
    outcome.function = demangled ? demangled : function;
    outcome.original_function = function;
    outcome.filename = filename;
    outcome.lineno = lineno;
    outcome.symval = symval;

    outcome_callback_(outcome);

    free(demangled);
  }